

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O0

int run_helper_pipe_echo_server(void)

{
  int iVar1;
  uint local_c;
  
  loop = uv_default_loop();
  iVar1 = pipe_echo_start("/tmp/uv-test-sock");
  if (iVar1 == 0) {
    notify_parent_process();
    uv_run(loop,UV_RUN_DEFAULT);
  }
  local_c = (uint)(iVar1 != 0);
  return local_c;
}

Assistant:

HELPER_IMPL(pipe_echo_server) {
  loop = uv_default_loop();

  if (pipe_echo_start(TEST_PIPENAME))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}